

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucket.cpp
# Opt level: O0

void __thiscall bucket::insert(bucket *this,index index)

{
  bucket *this_local;
  undefined1 local_14 [8];
  index index_local;
  
  index_local.file_id = index.value;
  local_14 = index._0_8_;
  std::vector<index,_std::allocator<index>_>::push_back(&this->indices,(value_type *)local_14);
  this->size = this->size + '\x01';
  return;
}

Assistant:

void bucket::insert(index index) {
    indices.push_back(index);
    size++;
}